

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O1

void __thiscall
t_go_generator::generate_go_equals
          (t_go_generator *this,ostream *out,t_type *ori_type,string *tgt,string *src)

{
  uint uVar1;
  pointer pcVar2;
  int iVar3;
  t_type *ttype;
  ostream *poVar4;
  undefined4 extraout_var;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  size_type *psVar7;
  t_type *ttype_00;
  size_type sVar8;
  char *pcVar9;
  _Alloc_hider _Var10;
  undefined1 auVar11 [12];
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ttype = t_type::get_true_type(ori_type);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar3 != '\0') {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(pbVar6,"compiler error: cannot generate equals for void type: ",tgt);
LAB_0020185a:
    __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar3 != '\0') ||
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar3 != '\0')) {
    pcVar2 = (tgt->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + tgt->_M_string_length);
    pcVar2 = (src->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + src->_M_string_length);
    generate_go_equals_struct(this,out,ttype_00,&local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    _Var10._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
LAB_00201630:
    operator_delete(_Var10._M_p);
    return;
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  if ((char)iVar3 != '\0') {
    pcVar2 = (tgt->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + tgt->_M_string_length);
    pcVar2 = (src->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar2,pcVar2 + src->_M_string_length);
    generate_go_equals_container(this,out,ttype,&local_b0,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    _Var10._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return;
    }
    goto LAB_00201630;
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar3 == '\0')) {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    std::operator+(&local_50,"compiler error: Invalid type in generate_go_equals \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar3));
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_f0._M_dataplus._M_p = (pointer)*plVar5;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_f0._M_dataplus._M_p == psVar7) {
      local_f0.field_2._M_allocated_capacity = *psVar7;
      local_f0.field_2._8_8_ = plVar5[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar7;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::operator+(&local_110,&local_f0,tgt);
    std::operator+(pbVar6,&local_110,"\'");
    __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  t_generator::indent_abi_cxx11_(&local_110,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if ",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
    if ((char)iVar3 == '\0') goto LAB_0020180c;
LAB_002017d7:
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(tgt->_M_dataplus)._M_p,tgt->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    pcVar9 = (src->_M_dataplus)._M_p;
    sVar8 = src->_M_string_length;
  }
  else {
    uVar1 = *(uint *)&ttype[1].super_t_doc._vptr_t_doc;
    if (uVar1 - 2 < 6) goto LAB_002017d7;
    if (uVar1 != 1) {
      if (uVar1 != 0) {
        auVar11 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_(&local_110,(t_base_type *)(ulong)uVar1,auVar11._8_4_);
        std::operator+(auVar11._0_8_,"compiler error: no Go name for base type ",&local_110);
        __cxa_throw(auVar11._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::operator+(pbVar6,"compiler error: cannot equals void: ",tgt);
      goto LAB_0020185a;
    }
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
    if ((char)iVar3 == '\0') goto LAB_002017d7;
    std::__ostream_insert<char,std::char_traits<char>>(out,"bytes.Compare(",0xe);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(tgt->_M_dataplus)._M_p,tgt->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(src->_M_dataplus)._M_p,src->_M_string_length);
    pcVar9 = ") != 0";
    sVar8 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar9,sVar8);
LAB_0020180c:
  std::__ostream_insert<char,std::char_traits<char>>(out," { return false }",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_go_generator::generate_go_equals(ostream& out, t_type* ori_type, string tgt, string src) {

  t_type* ttype = get_true_type(ori_type);
  // Do nothing for void types
  if (ttype->is_void()) {
    throw "compiler error: cannot generate equals for void type: " + tgt;
  }

  if (ttype->is_struct() || ttype->is_xception()) {
    generate_go_equals_struct(out, ttype, tgt, src);
  } else if (ttype->is_container()) {
    generate_go_equals_container(out, ttype, tgt, src);
  } else if (ttype->is_base_type() || ttype->is_enum()) {
    out << indent() << "if ";
    if (ttype->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot equals void: " + tgt;
        break;

      case t_base_type::TYPE_STRING:
        if (ttype->is_binary()) {
          out << "bytes.Compare(" << tgt << ", " << src << ") != 0";
        } else {
          out << tgt << " != " << src;
        }
        break;

      case t_base_type::TYPE_BOOL:
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
      case t_base_type::TYPE_DOUBLE:
        out << tgt << " != " << src;
        break;

      default:
        throw "compiler error: no Go name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (ttype->is_enum()) {
      out << tgt << " != " << src;
    }

    out << " { return false }" << endl;
  } else {
    throw "compiler error: Invalid type in generate_go_equals '" + ttype->get_name() + "' for '"
        + tgt + "'";
  }
}